

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O1

void __thiscall APlayerPawn::RemoveInventory(APlayerPawn *this,AInventory *item)

{
  player_t *ppVar1;
  AInventory *pAVar2;
  
  if ((this->super_AActor).player == (player_t *)0x0) goto LAB_0046868e;
  pAVar2 = (this->InvSel).field_0.p;
  if ((pAVar2 != (AInventory *)0x0) &&
     (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->InvSel).field_0.p = (AInventory *)0x0;
    pAVar2 = (AInventory *)0x0;
  }
  if (pAVar2 == item) {
    pAVar2 = AInventory::NextInv(item);
    (this->InvSel).field_0.p = pAVar2;
    if (pAVar2 != (AInventory *)0x0) {
      if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0)
      goto LAB_0046860c;
      (this->InvSel).field_0.p = (AInventory *)0x0;
    }
    pAVar2 = AInventory::PrevInv(item);
    (this->InvSel).field_0.p = pAVar2;
  }
LAB_0046860c:
  pAVar2 = (this->InvFirst).field_0.p;
  if ((pAVar2 != (AInventory *)0x0) &&
     (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->InvFirst).field_0.p = (AInventory *)0x0;
    pAVar2 = (AInventory *)0x0;
  }
  if (pAVar2 == item) {
    pAVar2 = AInventory::NextInv(item);
    (this->InvFirst).field_0.p = pAVar2;
    if (pAVar2 != (AInventory *)0x0) {
      if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0)
      goto LAB_00468664;
      (this->InvFirst).field_0.p = (AInventory *)0x0;
    }
    pAVar2 = AInventory::PrevInv(item);
    (this->InvFirst).field_0.p = pAVar2;
  }
LAB_00468664:
  ppVar1 = (this->super_AActor).player;
  if (ppVar1->PendingWeapon == (AWeapon *)item) {
    ppVar1->PendingWeapon = (AWeapon *)AWeapon::RegistrationInfo.MyClass;
  }
  if (ppVar1->ReadyWeapon == (AWeapon *)item) {
    ppVar1->ReadyWeapon = (AWeapon *)0x0;
    ppVar1->refire = 0;
    AActor::RemoveInventory(&this->super_AActor,item);
    ppVar1 = (this->super_AActor).player;
    if ((ppVar1->mo == this) &&
       (ppVar1->PendingWeapon == (AWeapon *)AWeapon::RegistrationInfo.MyClass)) {
      PickNewWeapon(this,(PClassAmmo *)0x0);
      return;
    }
    return;
  }
LAB_0046868e:
  AActor::RemoveInventory(&this->super_AActor,item);
  return;
}

Assistant:

void APlayerPawn::RemoveInventory (AInventory *item)
{
	bool pickWeap = false;

	// Since voodoo dolls aren't supposed to have an inventory, there should be
	// no need to redirect them to the real player here as there is with AddInventory.

	// If the item removed is the selected one, select something else, either the next
	// item, if there is one, or the previous item.
	if (player != NULL)
	{
		if (InvSel == item)
		{
			InvSel = item->NextInv ();
			if (InvSel == NULL)
			{
				InvSel = item->PrevInv ();
			}
		}
		if (InvFirst == item)
		{
			InvFirst = item->NextInv ();
			if (InvFirst == NULL)
			{
				InvFirst = item->PrevInv ();
			}
		}
		if (item == player->PendingWeapon)
		{
			player->PendingWeapon = WP_NOCHANGE;
		}
		if (item == player->ReadyWeapon)
		{
			// If the current weapon is removed, clear the refire counter and pick a new one.
			pickWeap = true;
			player->ReadyWeapon = NULL;
			player->refire = 0;
		}
	}
	Super::RemoveInventory (item);
	if (pickWeap && player->mo == this && player->PendingWeapon == WP_NOCHANGE)
	{
		PickNewWeapon (NULL);
	}
}